

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

Maybe<capnp::DynamicValue::Reader> * __thiscall
capnp::compiler::NodeTranslator::readConstant
          (Maybe<capnp::DynamicValue::Reader> *__return_storage_ptr__,NodeTranslator *this,
          Reader source,bool isBootstrap)

{
  ElementCount elementCount;
  Arena *pAVar1;
  Resolver *pRVar2;
  ErrorReporter *pEVar3;
  PointerReader reader;
  PointerReader reader_00;
  Builder target;
  Field field;
  ImplicitParams implicitMethodParams;
  undefined1 auVar4 [40];
  Reader name;
  Reader name_00;
  undefined8 *puVar5;
  undefined7 uVar6;
  undefined1 auVar7 [16];
  CapTableReader *pCVar8;
  void *pvVar9;
  bool bVar10;
  undefined8 uVar11;
  SegmentBuilder *pSVar12;
  CapTableBuilder *pCVar13;
  undefined4 uVar14;
  ConstSchema CVar15;
  StructSchema schema;
  char *pcVar16;
  uint uVar17;
  _func_int **pp_Var18;
  SegmentReader *pSVar19;
  undefined7 in_register_00000011;
  WirePointer *pWVar20;
  word *pwVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  size_t newSize;
  undefined8 uVar25;
  SegmentReader *pSVar26;
  char (*in_R8) [32];
  ulong uVar27;
  ulong uVar28;
  BrandScope *pBVar29;
  ulong uVar30;
  ListSchema schema_00;
  Reader RVar31;
  DebugExpression<bool> _kjCondition;
  Reader proto;
  Type constType;
  Schema constSchema;
  Builder bindings;
  Reader constValue;
  Reader objValue;
  MallocMessageBuilder builder;
  ReaderFor<DynamicTypeFor<FromReader<Reader>_>_> dynamicConst;
  BrandedDecl constDecl;
  Builder constBrand;
  undefined4 uVar32;
  undefined4 uVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  StructDataBitCount SVar36;
  Fault local_508;
  undefined7 uVar37;
  undefined1 uVar38;
  undefined7 uVar39;
  undefined1 uVar40;
  undefined4 uVar41;
  undefined2 uVar42;
  undefined1 uVar43;
  undefined1 uVar44;
  undefined4 uVar45;
  undefined2 uVar46;
  undefined1 uVar47;
  undefined1 uVar48;
  undefined4 uVar49;
  undefined2 uVar50;
  undefined1 uVar51;
  undefined1 in_stack_fffffffffffffb27;
  undefined4 uVar52;
  undefined4 in_stack_fffffffffffffb2c;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  Reader local_4b8;
  PointerBuilder local_480;
  Schema local_468;
  undefined4 local_45c;
  Reader local_458;
  undefined7 uStack_418;
  Maybe<capnp::DynamicValue::Reader> *local_410;
  Maybe<capnp::compiler::BrandedDecl> local_408;
  char *local_358;
  long local_350;
  StructBuilder local_348;
  ulong local_300;
  ulong local_2f8;
  BrandScope *local_2f0;
  ArrayPtr<const_char> local_2e8;
  undefined1 local_2d8 [16];
  ArrayDisposer *local_2c8;
  undefined8 *puStack_2c0;
  undefined8 *local_2b8;
  void *pvStack_2b0;
  void *local_2a8;
  char local_2a0;
  void *local_298;
  void *pvStack_290;
  void *local_288;
  void *pvStack_280;
  void *local_278;
  void *pvStack_270;
  undefined4 local_268;
  undefined4 uStack_264;
  BrandScope *pBStack_260;
  undefined1 local_1e0 [56];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  BrandedDecl local_170;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  StructBuilder local_88 [2];
  
  local_170.body.tag = 0;
  local_170.brand.disposer = (Disposer *)0x0;
  local_170.brand.ptr = (BrandScope *)0x0;
  local_170.source._reader.segment = (SegmentReader *)0x0;
  local_170.source._reader.capTable = (CapTableReader *)0x0;
  local_170.source._reader.data = (void *)0x0;
  local_170.source._reader.pointers._0_6_ = 0;
  local_170.source._reader.pointers._6_2_ = 0;
  local_170.source._reader.dataSize = 0;
  local_170.source._reader.pointerCount = 0;
  local_170.source._reader.nestingLimit = 0x7fffffff;
  uVar45 = 0;
  uVar46 = 0;
  uVar47 = 0;
  uVar48 = 0;
  uVar49 = 0;
  uVar50 = 0;
  uVar39 = 0;
  uVar40 = 0;
  uVar41 = 0;
  uVar42 = 0;
  uVar43 = 0;
  uVar44 = 0;
  local_508.exception._0_4_ = UNKNOWN;
  local_508.exception._4_4_ = 0;
  uVar37 = 0;
  uVar38 = 0;
  uVar51 = 7;
  uVar52 = 0x7fffffff;
  implicitMethodParams.params.reader._44_4_ = in_stack_fffffffffffffb2c;
  implicitMethodParams.params.reader.nestingLimit = 0x7fffffff;
  implicitMethodParams.params.reader._39_1_ = in_stack_fffffffffffffb27;
  implicitMethodParams.params.reader.structDataSize = 0;
  implicitMethodParams.params.reader.structPointerCount = 0;
  implicitMethodParams.params.reader.elementSize = INLINE_COMPOSITE;
  uVar33 = source._reader.data._0_4_;
  uVar34 = source._reader.data._4_4_;
  uVar35 = source._reader.pointers._0_4_;
  uVar14 = source._reader.segment._0_4_;
  uVar32 = source._reader.capTable._0_4_;
  auVar4 = ZEXT1640(ZEXT816(0));
  implicitMethodParams.scopeId = auVar4._0_8_;
  implicitMethodParams.params.reader.segment = (SegmentReader *)auVar4._8_8_;
  implicitMethodParams.params.reader.capTable = (CapTableReader *)auVar4._16_8_;
  implicitMethodParams.params.reader.ptr = (byte *)auVar4._24_8_;
  implicitMethodParams.params.reader.elementCount = auVar4._32_4_;
  implicitMethodParams.params.reader.step = auVar4._36_4_;
  BrandScope::compileDeclExpression
            (&local_408,(this->localBrand).ptr,source,this->resolver,implicitMethodParams);
  bVar10 = local_408.ptr.isSet;
  local_2d8[0] = local_408.ptr.isSet;
  if (local_408.ptr.isSet == true) {
    local_2d8._8_4_ = local_408.ptr.field_1.value.body.tag;
    if (local_408.ptr.field_1.value.body.tag == 2) {
      local_2c8 = (ArrayDisposer *)local_408.ptr.field_1._8_8_;
      puStack_2c0 = (undefined8 *)local_408.ptr.field_1._16_8_;
    }
    else if (local_408.ptr.field_1.value.body.tag == 1) {
      local_2a8 = (void *)local_408.ptr.field_1._40_8_;
      local_2b8 = (undefined8 *)local_408.ptr.field_1._24_8_;
      pvStack_2b0 = (void *)local_408.ptr.field_1._32_8_;
      local_2c8 = (ArrayDisposer *)local_408.ptr.field_1._8_8_;
      puStack_2c0 = (undefined8 *)local_408.ptr.field_1._16_8_;
      local_2a0 = local_408.ptr.field_1._48_1_;
      if (local_408.ptr.field_1._48_1_ == '\x01') {
        local_278 = (void *)local_408.ptr.field_1._88_8_;
        pvStack_270 = (void *)local_408.ptr.field_1._96_8_;
        local_288 = (void *)local_408.ptr.field_1._72_8_;
        pvStack_280 = (void *)local_408.ptr.field_1._80_8_;
        local_298 = (void *)local_408.ptr.field_1._56_8_;
        pvStack_290 = (void *)local_408.ptr.field_1._64_8_;
        local_408.ptr.field_1._48_1_ = '\0';
      }
    }
    pBStack_260 = local_408.ptr.field_1.value.brand.ptr;
    uStack_264 = local_408.ptr.field_1._108_4_;
    local_268 = local_408.ptr.field_1._104_4_;
    local_408.ptr.field_1.value.brand.ptr = (BrandScope *)0x0;
    if (local_408.ptr.field_1.value.body.tag == 1) {
      local_408.ptr.field_1._0_8_ = local_408.ptr.field_1._0_8_ & 0xffffffff00000000;
    }
    if (local_408.ptr.field_1.value.body.tag == 2) {
      local_408.ptr.field_1._0_8_ = local_408.ptr.field_1._0_8_ & 0xffffffff00000000;
    }
  }
  if (local_408.ptr.isSet == true) {
    BrandedDecl::operator=(&local_170,(BrandedDecl *)(local_2d8 + 8));
  }
  else {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  pBVar29 = pBStack_260;
  if (local_2d8[0] == '\x01') {
    if (pBStack_260 != (BrandScope *)0x0) {
      pBStack_260 = (BrandScope *)0x0;
      (*(code *)**(undefined8 **)CONCAT44(uStack_264,local_268))
                ((undefined8 *)CONCAT44(uStack_264,local_268),
                 (_func_int *)
                 ((long)&(pBVar29->super_Refcounted).super_Disposer._vptr_Disposer +
                 (long)(pBVar29->super_Refcounted).super_Disposer._vptr_Disposer[-2]));
    }
    if (local_2d8._8_4_ == 1) {
      local_2d8._8_8_ = local_2d8._8_8_ & 0xffffffff00000000;
    }
    if (local_2d8._8_4_ == 2) {
      local_2d8._8_8_ = local_2d8._8_8_ & 0xffffffff00000000;
    }
  }
  if (bVar10 == false) goto LAB_0016fcde;
  local_45c = (undefined4)CONCAT71(in_register_00000011,isBootstrap);
  BrandedDecl::getKind(&local_170);
  if ((local_2d8[0] != '\x01') || (local_2d8._2_2_ != 2)) {
    pEVar3 = this->errorReporter;
    name._reader.segment._7_1_ = uVar38;
    name._reader.segment._0_7_ = uVar37;
    name._reader.capTable._0_7_ = uVar39;
    name._reader.capTable._7_1_ = uVar40;
    name._reader.data._0_4_ = uVar41;
    name._reader.data._4_2_ = uVar42;
    name._reader.data._6_1_ = uVar43;
    name._reader.data._7_1_ = uVar44;
    name._reader.pointers._0_4_ = uVar45;
    name._reader.pointers._4_2_ = uVar46;
    name._reader.pointers._6_1_ = uVar47;
    name._reader.pointers._7_1_ = uVar48;
    name._reader.dataSize = uVar49;
    name._reader.pointerCount = uVar50;
    name._reader._38_1_ = uVar51;
    name._reader._39_1_ = in_stack_fffffffffffffb27;
    name._reader.nestingLimit = uVar52;
    name._reader._44_4_ = in_stack_fffffffffffffb2c;
    SVar36 = source._reader.dataSize;
    expressionString(name);
    kj::str<char_const(&)[2],kj::String,char_const(&)[32]>
              ((String *)local_2d8,(kj *)0x2223ec,(char (*) [2])&local_408,
               (String *)"\' does not refer to a constant.",in_R8);
    pp_Var18 = (_func_int **)local_2d8._0_8_;
    if ((void *)local_2d8._8_8_ == (void *)0x0) {
      pp_Var18 = (_func_int **)0x237f1b;
    }
    uVar28 = 0;
    uVar30 = 0;
    if (0x3f < source._reader.dataSize) {
      uVar30 = (ulong)*(uint *)((long)source._reader.data + 4);
    }
    if (0x9f < source._reader.dataSize) {
      uVar28 = (ulong)*(uint *)((long)source._reader.data + 0x10);
    }
    (**pEVar3->_vptr_ErrorReporter)
              (pEVar3,uVar30,uVar28,pp_Var18,
               local_2d8._8_8_ + (ulong)((void *)local_2d8._8_8_ == (void *)0x0));
    uVar11 = local_2d8._8_8_;
    uVar25 = local_2d8._0_8_;
    if ((_func_int **)local_2d8._0_8_ != (_func_int **)0x0) {
      local_2d8._0_8_ = (_func_int **)0x0;
      local_2d8._8_8_ = (void *)0x0;
      (**local_2c8->_vptr_ArrayDisposer)
                (local_2c8,uVar25,1,uVar11,uVar11,0,uVar14,uVar32,uVar33,uVar35,SVar36,
                 source._reader.nestingLimit);
    }
    uVar11 = local_408.ptr.field_1._0_8_;
    uVar25 = local_408.ptr._0_8_;
    if ((SegmentBuilder *)local_408.ptr._0_8_ != (SegmentBuilder *)0x0) {
      local_408.ptr._0_8_ = (SegmentBuilder *)0x0;
      local_408.ptr.field_1._0_8_ = (undefined8 *)0x0;
      (*(code *)**(undefined8 **)local_408.ptr.field_1._8_8_)
                (local_408.ptr.field_1._8_8_,uVar25,1,uVar11,uVar11,0);
    }
    (__return_storage_ptr__->ptr).isSet = false;
    goto LAB_0016fcde;
  }
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_2d8,0x100,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_508,(MessageBuilder *)local_2d8);
  local_408.ptr.field_1._8_8_ = CONCAT17(uVar40,uVar39);
  local_408.ptr._0_8_ = CONCAT44(local_508.exception._4_4_,(Type)local_508.exception);
  local_408.ptr.field_1._0_8_ = CONCAT17(uVar38,uVar37);
  capnp::_::PointerBuilder::getStruct
            (local_88,(PointerBuilder *)&local_408,(StructSize)0x10000,(word *)0x0);
  local_508.exception._0_4_ = CONCAT31(local_508.exception._1_3_,local_170.body.tag == 1);
  local_410 = __return_storage_ptr__;
  if (local_170.body.tag != 1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&local_408,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.h"
               ,0x115,FAILED,"body.is<Resolver::ResolvedDecl>()","_kjCondition,",
               (DebugExpression<bool> *)&local_508);
    kj::_::Debug::Fault::fatal((Fault *)&local_408);
  }
  local_4b8._reader.segment = (SegmentReader *)0x0;
  local_4b8._reader.capTable = (CapTableReader *)0x0;
  local_4b8._reader.data = (SegmentReader *)0x0;
  local_4b8._reader.pointers = (WirePointer *)&kj::NullArrayDisposer::instance;
  local_2f0 = local_170.brand.ptr;
  pBVar29 = local_170.brand.ptr;
  do {
    if (((pBVar29->params).size_ != 0) ||
       ((pBVar29->inherited == true && (pBVar29->leafParamCount != 0)))) {
      if (local_4b8._reader.capTable == (CapTableReader *)local_4b8._reader.data) {
        newSize = (long)local_4b8._reader.data - (long)local_4b8._reader.segment >> 2;
        if ((SegmentReader *)local_4b8._reader.data == local_4b8._reader.segment) {
          newSize = 4;
        }
        kj::Vector<capnp::compiler::BrandScope_*>::setCapacity
                  ((Vector<capnp::compiler::BrandScope_*> *)&local_4b8,newSize);
      }
      (local_4b8._reader.capTable)->_vptr_CapTableReader = (_func_int **)pBVar29;
      local_4b8._reader.capTable = (CapTableReader *)((long)local_4b8._reader.capTable + 8);
    }
    pBVar29 = (pBVar29->parent).ptr.ptr;
  } while (pBVar29 != (BrandScope *)0x0);
  if ((long)local_4b8._reader.capTable - (long)local_4b8._reader.segment != 0) {
    local_508.exception._0_4_ = (Type)local_88[0].segment;
    local_508.exception._4_4_ = (undefined4)((ulong)local_88[0].segment >> 0x20);
    uVar37 = SUB87(local_88[0].capTable,0);
    uVar38 = (undefined1)((ulong)local_88[0].capTable >> 0x38);
    uVar39 = SUB87(local_88[0].pointers,0);
    uVar40 = (undefined1)((ulong)local_88[0].pointers >> 0x38);
    capnp::_::PointerBuilder::initStructList
              ((ListBuilder *)&local_408,(PointerBuilder *)&local_508,
               (ElementCount)
               ((ulong)((long)local_4b8._reader.capTable - (long)local_4b8._reader.segment) >> 3),
               (StructSize)0x10002);
    if ((long)local_4b8._reader.capTable - (long)local_4b8._reader.segment != 0) {
      uVar28 = (long)local_4b8._reader.capTable - (long)local_4b8._reader.segment >> 3;
      uVar30 = 0;
      local_300 = uVar28;
      do {
        capnp::_::ListBuilder::getStructElement
                  ((StructBuilder *)&local_508,(ListBuilder *)&local_408,(ElementCount)uVar30);
        uVar23 = uVar30 & 0xffffffff;
        pAVar1 = (&(local_4b8._reader.segment)->arena)[uVar23];
        puVar5 = (undefined8 *)CONCAT17(uVar40,uVar39);
        *puVar5 = pAVar1[5]._vptr_Arena;
        if (*(undefined1 *)((long)&pAVar1[6]._vptr_Arena + 4) == '\x01') {
          *(undefined2 *)(puVar5 + 1) = 1;
        }
        else {
          elementCount = *(ElementCount *)
                          &(&(local_4b8._reader.segment)->arena)[uVar23][8]._vptr_Arena;
          *(undefined2 *)(puVar5 + 1) = 0;
          local_1e0._4_4_ = local_508.exception._4_4_;
          local_1e0._0_4_ = (Type)local_508.exception;
          local_1e0[0xf] = uVar38;
          local_1e0._8_7_ = uVar37;
          local_1e0._16_8_ = CONCAT17(uVar44,CONCAT16(uVar43,CONCAT24(uVar42,uVar41)));
          local_2f8 = uVar30;
          capnp::_::PointerBuilder::initStructList
                    ((ListBuilder *)&local_458,(PointerBuilder *)local_1e0,elementCount,
                     (StructSize)0x10001);
          uVar24 = (ulong)(uint)local_458.reader.capTable._0_4_;
          uVar28 = local_300;
          uVar30 = local_2f8;
          if (uVar24 != 0) {
            lVar22 = 0;
            uVar27 = 0;
            do {
              pp_Var18 = (&(local_4b8._reader.segment)->arena)[uVar23][7]._vptr_Arena;
              pEVar3 = local_2f0->errorReporter;
              capnp::_::ListBuilder::getStructElement
                        ((StructBuilder *)local_1e0,(ListBuilder *)&local_458,(ElementCount)uVar27);
              *(undefined2 *)&((WireValue<uint32_t> *)local_1e0._16_8_)->value = 1;
              local_480.capTable = (CapTableBuilder *)local_1e0._8_8_;
              local_480.segment = (SegmentBuilder *)local_1e0._0_8_;
              local_480.pointer = (WirePointer *)local_1e0._24_8_;
              capnp::_::PointerBuilder::initStruct(&local_348,&local_480,(StructSize)0x10003);
              target._builder.capTable._0_4_ = (int)local_348.capTable;
              target._builder.segment = local_348.segment;
              target._builder.capTable._4_4_ = (int)((ulong)local_348.capTable >> 0x20);
              target._builder.data._0_4_ = (int)local_348.data;
              target._builder.data._4_4_ = (int)((ulong)local_348.data >> 0x20);
              target._builder.pointers._0_4_ = (ListElementCount)local_348.pointers;
              target._builder.pointers._4_4_ = local_348.pointers._4_4_;
              target._builder.dataSize = local_348.dataSize;
              target._builder._36_4_ = local_348._36_4_;
              BrandedDecl::compileAsType((BrandedDecl *)((long)pp_Var18 + lVar22),pEVar3,target);
              uVar27 = uVar27 + 1;
              lVar22 = lVar22 + 0xa8;
              uVar28 = local_300;
              uVar30 = local_2f8;
            } while (uVar24 != uVar27);
          }
        }
        uVar30 = uVar30 + 1;
      } while (uVar30 != uVar28);
    }
  }
  pvVar9 = local_4b8._reader.data;
  pCVar8 = local_4b8._reader.capTable;
  pSVar19 = local_4b8._reader.segment;
  if (local_4b8._reader.segment != (SegmentReader *)0x0) {
    local_4b8._reader.segment = (SegmentReader *)0x0;
    local_4b8._reader.capTable = (CapTableReader *)0x0;
    local_4b8._reader.data = (SegmentReader *)0x0;
    (**(code **)*local_4b8._reader.pointers)
              (local_4b8._reader.pointers,pSVar19,8,(long)pCVar8 - (long)pSVar19 >> 3,
               (long)pvVar9 - (long)pSVar19 >> 3,0);
  }
  local_468.raw = (RawBrandedSchema *)(capnp::_::NULL_SCHEMA + 0x48);
  pRVar2 = this->resolver;
  capnp::_::StructBuilder::asReader(local_88);
  (*pRVar2->_vptr_Resolver[6])(&local_408,pRVar2,local_170.body.field_1._0_8_);
  __return_storage_ptr__ = local_410;
  if (local_408.ptr.isSet == true) {
    local_468.raw = (RawBrandedSchema *)local_408.ptr.field_1._0_8_;
  }
  else {
    (local_410->ptr).isSet = false;
  }
  if (local_408.ptr.isSet != false) {
    Schema::getProto(&local_4b8,&local_468);
    if ((char)local_45c == '\0') {
      (*this->resolver->_vptr_Resolver[7])(&local_408,this->resolver,local_170.body.field_1._0_8_);
      if (local_408.ptr.isSet == true) {
        uVar48 = (undefined1)local_408.ptr.field_1._32_8_;
        uVar49 = (undefined4)((ulong)local_408.ptr.field_1._32_8_ >> 8);
        uVar50 = (undefined2)((ulong)local_408.ptr.field_1._32_8_ >> 0x28);
        uVar51 = (undefined1)((ulong)local_408.ptr.field_1._32_8_ >> 0x38);
        in_stack_fffffffffffffb27 = (undefined1)local_408.ptr.field_1._40_8_;
        uVar52 = (undefined4)((ulong)local_408.ptr.field_1._40_8_ >> 8);
        in_stack_fffffffffffffb2c._3_1_ = (undefined1)((uint)in_stack_fffffffffffffb2c >> 0x18);
        in_stack_fffffffffffffb2c._0_3_ = (undefined3)((ulong)local_408.ptr.field_1._40_8_ >> 0x28);
        uVar42 = (undefined2)((ulong)local_408.ptr.field_1._16_8_ >> 0x28);
        uVar43 = (undefined1)((ulong)local_408.ptr.field_1._16_8_ >> 0x38);
        uVar44 = (undefined1)local_408.ptr.field_1._24_8_;
        uVar45 = (undefined4)((ulong)local_408.ptr.field_1._24_8_ >> 8);
        uVar46 = (undefined2)((ulong)local_408.ptr.field_1._24_8_ >> 0x28);
        uVar47 = (undefined1)((ulong)local_408.ptr.field_1._24_8_ >> 0x38);
        local_508.exception._7_1_ = (undefined1)local_408.ptr.field_1._0_8_;
        local_4b8._reader.segment = (SegmentReader *)local_408.ptr.field_1._0_8_;
        local_4b8._reader.capTable = (CapTableReader *)local_408.ptr.field_1._8_8_;
        local_4b8._reader.data = (void *)local_408.ptr.field_1._16_8_;
        local_4b8._reader.pointers = (WirePointer *)local_408.ptr.field_1._24_8_;
        local_4b8._reader.dataSize = local_408.ptr.field_1._32_4_;
        local_4b8._reader.pointerCount = local_408.ptr.field_1._36_2_;
        local_4b8._reader._38_2_ = local_408.ptr.field_1._38_2_;
        local_4b8._reader._40_8_ = local_408.ptr.field_1._40_8_;
      }
      else {
        (__return_storage_ptr__->ptr).isSet = false;
      }
      if (local_408.ptr.isSet == false) goto LAB_0016fcd1;
    }
    if (local_4b8._reader.pointerCount < 5) {
      uVar14 = 0x7fffffff;
      pSVar19 = (SegmentReader *)0x0;
      pWVar20 = (WirePointer *)0x0;
      pSVar26 = (SegmentReader *)0x0;
    }
    else {
      pWVar20 = local_4b8._reader.pointers + 4;
      pSVar19 = (SegmentReader *)local_4b8._reader.capTable;
      pSVar26 = local_4b8._reader.segment;
      uVar14 = local_4b8._reader.nestingLimit;
    }
    local_508.exception._0_4_ = (Type)pSVar26;
    local_508.exception._4_4_ = (undefined4)((ulong)pSVar26 >> 0x20);
    uVar37 = SUB87(pSVar19,0);
    uVar38 = (undefined1)((ulong)pSVar19 >> 0x38);
    uVar39 = SUB87(pWVar20,0);
    uVar40 = (undefined1)((ulong)pWVar20 >> 0x38);
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_408,(PointerReader *)&local_508,(word *)0x0);
    local_1e0._8_8_ = local_408.ptr._0_8_;
    local_1e0._16_8_ = local_408.ptr.field_1._0_8_;
    local_1e0._24_8_ = local_408.ptr.field_1._8_8_;
    local_1e0._32_8_ = local_408.ptr.field_1._16_8_;
    local_1e0._40_8_ = local_408.ptr.field_1._24_8_;
    local_1e0._48_8_ = local_408.ptr.field_1._32_8_;
    local_1e0._0_8_ = (long)schemas::s_ce23dcd2d7b00c9b + 0x48;
    DynamicStruct::Reader::which
              ((Maybe<capnp::StructSchema::Field> *)&local_508,(Reader *)local_1e0);
    if (local_508.exception._0_1_ != true) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = local_480.capTable;
      local_480._0_16_ = auVar7 << 0x40;
      local_508.exception._0_4_ = UNKNOWN;
      local_508.exception._4_4_ = 0;
      kj::_::Debug::Fault::init
                ((Fault *)&local_480,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                );
      kj::_::Debug::Fault::fatal((Fault *)&local_480);
    }
    local_c8 = CONCAT17(uVar38,uVar37);
    uStack_c0 = CONCAT17(uVar40,uVar39);
    local_b8 = CONCAT17(uVar44,CONCAT16(uVar43,CONCAT24(uVar42,uVar14)));
    uVar6 = CONCAT16(uVar47,CONCAT24(uVar46,uVar45));
    uStack_b0 = CONCAT17(uVar48,uVar6);
    local_a8 = CONCAT17(in_stack_fffffffffffffb27,CONCAT16(uVar51,CONCAT24(uVar50,uVar49)));
    uStack_a0 = CONCAT44(in_stack_fffffffffffffb2c,uVar52);
    local_458.schema.elementType._7_1_ = SUB71(uVar37,0);
    local_458.schema.elementType.field_4.scopeId._0_7_ = (undefined7)((ulong)local_c8 >> 8);
    local_458.schema.elementType.field_4.scopeId._7_1_ = (undefined1)uVar39;
    local_458.reader.segment._0_7_ = (undefined7)((ulong)uStack_c0 >> 8);
    local_458.reader.segment._7_1_ = (undefined1)uVar14;
    local_458.reader.capTable._0_4_ = (undefined4)(CONCAT24(uVar42,uVar14) >> 8);
    local_458.reader.capTable._4_3_ = (undefined3)((ulong)local_b8 >> 0x28);
    local_458.reader.capTable._7_1_ = (undefined1)uVar45;
    local_458.reader.ptr._0_4_ = (uint)(CONCAT24(uVar46,uVar45) >> 8);
    local_458.reader.ptr._4_2_ = (short)((uint7)uVar6 >> 0x28);
    local_458.reader.ptr._7_1_ = (undefined1)uVar49;
    local_458.reader.elementCount = (ListElementCount)(CONCAT24(uVar50,uVar49) >> 8);
    local_458.reader.step._0_3_ = (undefined3)((ulong)local_a8 >> 0x28);
    local_458.reader.step._3_1_ = (undefined1)uVar52;
    local_458.reader._32_7_ = SUB87((ulong)uStack_a0 >> 8,0);
    local_458.reader._39_1_ = SUB81(local_4d0,0);
    local_458.reader._40_7_ = SUB87((ulong)local_4d0 >> 8,0);
    local_458.reader._47_1_ = SUB81(uStack_4c8,0);
    uStack_418 = (undefined7)((ulong)uStack_4c8 >> 8);
    field.parent.super_Schema.raw._4_4_ = (int)((ulong)local_c8 >> 0x20);
    field.parent.super_Schema.raw._0_4_ = (int)uVar37;
    field.index = (int)uVar39;
    field._12_4_ = (int)((ulong)uStack_c0 >> 0x20);
    field.proto._reader.segment._0_4_ = uVar14;
    field.proto._reader.segment._4_4_ = (int)((ulong)local_b8 >> 0x20);
    field.proto._reader.capTable._0_4_ = uVar45;
    field.proto._reader.capTable._4_4_ = (int)((ulong)uStack_b0 >> 0x20);
    field.proto._reader.data._0_4_ = uVar49;
    field.proto._reader.data._4_4_ = (int)((ulong)local_a8 >> 0x20);
    field.proto._reader.pointers._0_4_ = uVar52;
    field.proto._reader.pointers._4_4_ = in_stack_fffffffffffffb2c;
    field.proto._reader._32_8_ = local_4d0;
    field.proto._reader._40_8_ = uStack_4c8;
    local_458.reader.ptr._6_1_ = uVar48;
    DynamicStruct::Reader::get((Reader *)&local_408,(Reader *)local_1e0,field);
    if (local_408.ptr._0_4_ == ANY_POINTER) {
      DynamicValue::Reader::AsImpl<capnp::AnyPointer,_(capnp::Kind)7>::apply
                ((ReaderFor<AnyPointer> *)&local_348,(Reader *)&local_408);
      CVar15 = Schema::asConst(&local_468);
      local_508.exception._0_4_ = (Type)CVar15.super_Schema.raw;
      local_508.exception._4_4_ = CVar15.super_Schema.raw._4_4_;
      local_480._0_16_ = ConstSchema::getType((ConstSchema *)&local_508);
      uVar17 = 0xe;
      if (local_480.segment._2_1_ == '\0') {
        uVar17 = (uint)local_480.segment;
      }
      if ((short)uVar17 == 0xe) {
        schema_00 = Type::asList((Type *)&local_480);
        reader_00.capTable._0_4_ = (int)local_348.capTable;
        reader_00.segment = &(local_348.segment)->super_SegmentReader;
        reader_00.capTable._4_4_ = (int)((ulong)local_348.capTable >> 0x20);
        reader_00.pointer._0_4_ = (int)local_348.data;
        reader_00.pointer._4_4_ = (int)((ulong)local_348.data >> 0x20);
        reader_00.nestingLimit = (ListElementCount)local_348.pointers;
        reader_00._28_4_ = local_348.pointers._4_4_;
        capnp::_::PointerHelpers<capnp::DynamicList,_(capnp::Kind)7>::getDynamic
                  (&local_458,reader_00,schema_00);
        local_508.exception._0_4_ = LIST;
        uVar14 = (undefined4)local_458.reader.segment._0_7_;
        uVar42 = (undefined2)((uint7)local_458.reader.segment._0_7_ >> 0x20);
        uVar43 = (undefined1)((uint7)local_458.reader.segment._0_7_ >> 0x30);
        uVar46 = (undefined2)local_458.reader.capTable._4_4_;
        uVar47 = (undefined1)((uint)local_458.reader.capTable._4_4_ >> 0x10);
        uVar48 = (undefined1)((uint)local_458.reader.capTable._4_4_ >> 0x18);
        uVar37 = local_458.schema.elementType._0_7_;
        uVar38 = local_458.schema.elementType._7_1_;
        uVar39 = local_458.schema.elementType.field_4.scopeId._0_7_;
        uVar40 = local_458.schema.elementType.field_4.scopeId._7_1_;
        uVar44 = local_458.reader.segment._7_1_;
        uVar45 = local_458.reader.capTable._0_4_;
        uVar49 = (uint)local_458.reader.ptr;
        uVar50 = local_458.reader.ptr._4_2_;
        uVar51 = local_458.reader.ptr._6_1_;
        in_stack_fffffffffffffb27 = local_458.reader.ptr._7_1_;
        uVar52 = local_458.reader.elementCount;
        in_stack_fffffffffffffb2c = local_458.reader.step;
        DynamicValue::Reader::operator=((Reader *)&local_408,(Reader *)&local_508);
        DynamicValue::Reader::~Reader((Reader *)&local_508);
      }
      else if ((uVar17 & 0xffff) == 0x10) {
        schema = Type::asStruct((Type *)&local_480);
        reader.capTable._0_4_ = (int)local_348.capTable;
        reader.segment = &(local_348.segment)->super_SegmentReader;
        reader.capTable._4_4_ = (int)((ulong)local_348.capTable >> 0x20);
        reader.pointer._0_4_ = (int)local_348.data;
        reader.pointer._4_4_ = (int)((ulong)local_348.data >> 0x20);
        reader.nestingLimit = (ListElementCount)local_348.pointers;
        reader._28_4_ = local_348.pointers._4_4_;
        capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
                  ((Reader *)&local_458,reader,schema);
        local_508.exception._0_4_ = STRUCT;
        uVar14 = (undefined4)local_458.reader.segment._0_7_;
        uVar42 = (undefined2)((uint7)local_458.reader.segment._0_7_ >> 0x20);
        uVar43 = (undefined1)((uint7)local_458.reader.segment._0_7_ >> 0x30);
        uVar46 = (undefined2)local_458.reader.capTable._4_4_;
        uVar47 = (undefined1)((uint)local_458.reader.capTable._4_4_ >> 0x10);
        uVar48 = (undefined1)((uint)local_458.reader.capTable._4_4_ >> 0x18);
        uVar37 = local_458.schema.elementType._0_7_;
        uVar38 = local_458.schema.elementType._7_1_;
        uVar39 = local_458.schema.elementType.field_4.scopeId._0_7_;
        uVar40 = local_458.schema.elementType.field_4.scopeId._7_1_;
        uVar44 = local_458.reader.segment._7_1_;
        uVar45 = local_458.reader.capTable._0_4_;
        uVar49 = (uint)local_458.reader.ptr;
        uVar50 = local_458.reader.ptr._4_2_;
        uVar51 = local_458.reader.ptr._6_1_;
        in_stack_fffffffffffffb27 = local_458.reader.ptr._7_1_;
        uVar52 = local_458.reader.elementCount;
        in_stack_fffffffffffffb2c = local_458.reader.step;
        DynamicValue::Reader::operator=((Reader *)&local_408,(Reader *)&local_508);
        DynamicValue::Reader::~Reader((Reader *)&local_508);
      }
      else if ((uVar17 & 0xffff) != 0x12) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55]>
                  (&local_508,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                   ,0x92f,FAILED,(char *)0x0,
                   "\"Unrecognized AnyPointer-typed member of schema::Value.\"",
                   (char (*) [55])"Unrecognized AnyPointer-typed member of schema::Value.");
        kj::_::Debug::Fault::fatal(&local_508);
      }
    }
    if ((0xf < source._reader.dataSize) && (*source._reader.data == 5)) {
      if (local_4b8._reader.dataSize < 0xc0) {
        pwVar21 = (word *)0x0;
      }
      else {
        pwVar21 = ((ArrayPtr<const_capnp::word> *)((long)local_4b8._reader.data + 0x10))->ptr;
      }
      local_188 = 0;
      local_198 = 0;
      uStack_190 = 0;
      local_1a8 = 0;
      uStack_1a0 = 0;
      uStack_180 = 0x7fffffff;
      (*this->resolver->_vptr_Resolver[6])(&local_508,this->resolver,pwVar21);
      local_480.segment._0_1_ = local_508.exception._0_1_;
      auVar7 = (undefined1  [16])local_480._0_16_;
      if (local_508.exception._0_1_ == true) {
        local_480.capTable._7_1_ = uVar38;
        local_480.capTable._0_7_ = uVar37;
        local_480.segment = auVar7._0_8_;
        Schema::getProto((Reader *)&local_508,(Schema *)&((Type *)&local_480)->field_4);
        pcVar16 = "";
        local_358 = "";
        local_350 = 1;
        lVar22 = 1;
        if ((0x6f < (uint)uVar45) && (*(short *)(CONCAT17(uVar40,uVar39) + 0xc) != 0)) {
          if (uVar46 == 0) {
            local_458.reader.capTable._0_4_ = 0x7fffffff;
            local_458.schema.elementType.field_4.scopeId._0_2_ = VOID;
            local_458.schema.elementType.field_4.scopeId._2_1_ = '\0';
            local_458.schema.elementType.field_4.scopeId._3_1_ = false;
            local_458.schema.elementType.field_4.scopeId._4_2_ =
                 (anon_union_2_2_d12d5221_for_Type_3)0x0;
            local_458.schema.elementType.field_4.scopeId._6_1_ = 0;
            local_458.schema.elementType.field_4.scopeId._7_1_ = 0;
            local_458.reader.segment._0_7_ = 0;
            local_458.reader.segment._7_1_ = 0;
            uVar25 = 0;
          }
          else {
            uVar25 = CONCAT44(local_508.exception._4_4_,(Type)local_508.exception);
            local_458.reader.segment._0_7_ = CONCAT16(uVar43,CONCAT24(uVar42,uVar14));
            local_458.reader.capTable._0_4_ = uVar49;
            local_458.schema.elementType.field_4.scopeId._0_7_ = uVar37;
            local_458.schema.elementType.field_4.scopeId._7_1_ = uVar38;
            local_458.reader.segment._7_1_ = uVar44;
          }
          local_458.schema.elementType._0_7_ = SUB87(uVar25,0);
          local_458.schema.elementType._7_1_ = SUB81((ulong)uVar25 >> 0x38,0);
          RVar31 = capnp::_::PointerReader::getBlob<capnp::Text>
                             ((PointerReader *)&local_458,(void *)0x0,0);
          if ((uint)uVar45 < 0x60) {
            uVar28 = 0;
          }
          else {
            uVar28 = (ulong)*(uint *)(CONCAT17(uVar40,uVar39) + 8);
          }
          pcVar16 = RVar31.super_StringPtr.content.ptr + uVar28;
          lVar22 = RVar31.super_StringPtr.content.size_ - uVar28;
        }
        if (source._reader.pointerCount == 0) {
          source._reader.nestingLimit = 0x7fffffff;
          source._reader.capTable = (CapTableReader *)0x0;
          source._reader.pointers = (WirePointer *)0x0;
          source._reader.segment = (SegmentReader *)0x0;
        }
        local_358 = pcVar16;
        local_350 = lVar22;
        local_348.segment = (SegmentBuilder *)source._reader.segment;
        local_348.capTable = (CapTableBuilder *)source._reader.capTable;
        local_348.data = source._reader.pointers;
        local_348.pointers._0_4_ = source._reader.nestingLimit;
        capnp::_::PointerReader::getStruct
                  ((StructReader *)&local_458,(PointerReader *)&local_348,(word *)0x0);
        if (local_458.reader.ptr._4_2_ == 0) {
          local_348.pointers._0_4_ = 0x7fffffff;
          local_348.capTable = (CapTableBuilder *)0x0;
          local_348.data = (undefined8 *)0x0;
          local_348.segment = (SegmentBuilder *)0x0;
        }
        else {
          local_348.segment =
               (SegmentBuilder *)
               CONCAT17(local_458.schema.elementType._7_1_,local_458.schema.elementType._0_7_);
          local_348.capTable =
               (CapTableBuilder *)
               CONCAT17(local_458.schema.elementType.field_4.scopeId._7_1_,
                        local_458.schema.elementType.field_4.scopeId._0_7_);
          local_348.data =
               (void *)CONCAT44(local_458.reader.capTable._4_4_,local_458.reader.capTable._0_4_);
          local_348.pointers._0_4_ = local_458.reader.elementCount;
        }
        local_2e8 = (ArrayPtr<const_char>)
                    capnp::_::PointerReader::getBlob<capnp::Text>
                              ((PointerReader *)&local_348,(void *)0x0,0);
        pEVar3 = this->errorReporter;
        name_00._reader.segment._7_1_ = uVar38;
        name_00._reader.segment._0_7_ = uVar37;
        name_00._reader.capTable._0_7_ = uVar39;
        name_00._reader.capTable._7_1_ = uVar40;
        name_00._reader.data._0_4_ = uVar14;
        name_00._reader.data._4_2_ = uVar42;
        name_00._reader.data._6_1_ = uVar43;
        name_00._reader.data._7_1_ = uVar44;
        name_00._reader.pointers._0_4_ = uVar45;
        name_00._reader.pointers._4_2_ = uVar46;
        name_00._reader.pointers._6_1_ = uVar47;
        name_00._reader.pointers._7_1_ = uVar48;
        name_00._reader.dataSize = uVar49;
        name_00._reader.pointerCount = uVar50;
        name_00._reader._38_1_ = uVar51;
        name_00._reader._39_1_ = in_stack_fffffffffffffb27;
        name_00._reader.nestingLimit = uVar52;
        name_00._reader._44_4_ = in_stack_fffffffffffffb2c;
        expressionString(name_00);
        kj::
        str<char_const(&)[71],kj::String,char_const(&)[9],kj::StringPtr&,char_const(&)[2],kj::StringPtr&,char_const(&)[32]>
                  ((String *)&local_458,
                   (kj *)"Constant names must be qualified to avoid confusion.  Please replace \'",
                   (char (*) [71])&local_348,(String *)"\' with \'",(char (*) [9])&local_358,
                   (StringPtr *)0x211a72,(char (*) [2])&local_2e8,
                   (StringPtr *)"\', if that\'s what you intended.",
                   (char (*) [32])CONCAT44(uVar34,uVar33));
        lVar22 = CONCAT17(local_458.schema.elementType.field_4.scopeId._7_1_,
                          local_458.schema.elementType.field_4.scopeId._0_7_);
        if (lVar22 == 0) {
          pcVar16 = "";
        }
        else {
          pcVar16 = (char *)CONCAT17(local_458.schema.elementType._7_1_,
                                     local_458.schema.elementType._0_7_);
        }
        uVar28 = 0;
        uVar30 = 0;
        if (0x3f < source._reader.dataSize) {
          uVar30 = (ulong)*(uint *)((long)source._reader.data + 4);
        }
        if (0x9f < source._reader.dataSize) {
          uVar28 = (ulong)*(uint *)((long)source._reader.data + 0x10);
        }
        (**pEVar3->_vptr_ErrorReporter)(pEVar3,uVar30,uVar28,pcVar16,lVar22 + (ulong)(lVar22 == 0));
        lVar22 = CONCAT17(local_458.schema.elementType._7_1_,local_458.schema.elementType._0_7_);
        if (lVar22 != 0) {
          uVar25 = CONCAT17(local_458.schema.elementType.field_4.scopeId._7_1_,
                            local_458.schema.elementType.field_4.scopeId._0_7_);
          local_458.schema.elementType.baseType = VOID;
          local_458.schema.elementType.listDepth = '\0';
          local_458.schema.elementType.isImplicitParam = false;
          local_458.schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
          local_458.schema.elementType._6_1_ = 0;
          local_458.schema.elementType._7_1_ = 0;
          local_458.schema.elementType.field_4.scopeId._0_2_ = VOID;
          local_458.schema.elementType.field_4.scopeId._2_1_ = '\0';
          local_458.schema.elementType.field_4.scopeId._3_1_ = false;
          local_458.schema.elementType.field_4.scopeId._4_2_ =
               (anon_union_2_2_d12d5221_for_Type_3)0x0;
          local_458.schema.elementType.field_4.scopeId._6_1_ = 0;
          local_458.schema.elementType.field_4.scopeId._7_1_ = 0;
          (*(code *)**(undefined8 **)
                      CONCAT17(local_458.reader.segment._7_1_,local_458.reader.segment._0_7_))
                    ((undefined8 *)
                     CONCAT17(local_458.reader.segment._7_1_,local_458.reader.segment._0_7_),lVar22,
                     1,uVar25,uVar25,0);
        }
        pCVar13 = local_348.capTable;
        pSVar12 = local_348.segment;
        if (local_348.segment != (SegmentBuilder *)0x0) {
          local_348.segment = (SegmentBuilder *)0x0;
          local_348.capTable = (CapTableBuilder *)0x0;
          (*(code *)**local_348.data)(local_348.data,pSVar12,1,pCVar13,pCVar13,0);
        }
      }
    }
    (__return_storage_ptr__->ptr).isSet = true;
    DynamicValue::Reader::Reader(&(__return_storage_ptr__->ptr).field_1.value,(Reader *)&local_408);
    DynamicValue::Reader::~Reader((Reader *)&local_408);
  }
LAB_0016fcd1:
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_2d8);
LAB_0016fcde:
  pBVar29 = local_170.brand.ptr;
  if (local_170.brand.ptr != (BrandScope *)0x0) {
    local_170.brand.ptr = (BrandScope *)0x0;
    (**(local_170.brand.disposer)->_vptr_Disposer)
              (local_170.brand.disposer,
               (_func_int *)
               ((long)&(pBVar29->super_Refcounted).super_Disposer._vptr_Disposer +
               (long)(pBVar29->super_Refcounted).super_Disposer._vptr_Disposer[-2]));
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<DynamicValue::Reader> NodeTranslator::readConstant(
    Expression::Reader source, bool isBootstrap) {
  // Look up the constant decl.
  BrandedDecl constDecl = nullptr;
  KJ_IF_SOME(decl, compileDeclExpression(source, ImplicitParams::none())) {
    constDecl = decl;
  } else {
    // Lookup will have reported an error.
    return kj::none;
  }